

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * CEDate::JD2GregorianVect(double jd)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  vector<double,_std::allocator<double>_> *in_RDI;
  double in_XMM0_Qa;
  vector<double,_std::allocator<double>_> *this;
  double dVar7;
  vector<int,_std::allocator<int>_> gregorian_date;
  vector<double,_std::allocator<double>_> full_gregorian_vect;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef8;
  allocator_type *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  undefined1 *__n;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  undefined1 local_71;
  undefined8 local_70;
  undefined4 local_64;
  vector<int,_std::allocator<int>_> local_60 [2];
  undefined8 local_30;
  vector<double,_std::allocator<double>_> local_28;
  double local_10;
  
  local_30 = 0;
  local_10 = in_XMM0_Qa;
  std::allocator<double>::allocator((allocator<double> *)0x158159);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (value_type_conflict *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::allocator<double>::~allocator((allocator<double> *)0x15818a);
  local_64 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x1581a7);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,(value_type_conflict2 *)in_stack_ffffffffffffff10,
             (allocator_type *)in_stack_ffffffffffffff08);
  std::allocator<int>::~allocator((allocator<int> *)0x1581d5);
  dVar7 = local_10;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_60,0);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_60,1);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_60,2);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,3);
  iVar1 = iauJd2cal(dVar7,0,pvVar2,pvVar3,pvVar4,pvVar5);
  if (iVar1 == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_60,0);
    this = (vector<double,_std::allocator<double>_> *)((double)*pvVar2 * 1.0);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,0);
    *pvVar5 = (value_type)this;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_60,1);
    dVar7 = (double)*pvVar2 * 1.0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,1);
    *pvVar5 = dVar7;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_60,2);
    in_stack_ffffffffffffff10 = (vector<double,_std::allocator<double>_> *)((double)*pvVar2 * 1.0);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,2);
    *pvVar5 = (value_type)in_stack_ffffffffffffff10;
    std::vector<double,_std::allocator<double>_>::vector(this,in_stack_fffffffffffffef8);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "[WARNING] CEDate::JD2GregorianVect() :: Bad date (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6,")!");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_70 = 0;
    __n = &local_71;
    std::allocator<double>::allocator((allocator<double> *)0x1582e9);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)poVar6,(size_type)__n,
               (value_type_conflict *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::allocator<double>::~allocator((allocator<double> *)0x158314);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff10);
  return in_RDI;
}

Assistant:

std::vector<double> CEDate::JD2GregorianVect(double jd)
{
    std::vector<double> full_gregorian_vect(4,0.0) ;
    std::vector<int> gregorian_date(3,0.0) ;
    
    // Try to fill the gregorian_date vector
    if (iauJd2cal(jd, 0, &gregorian_date[0], &gregorian_date[1],
                   &gregorian_date[2], &full_gregorian_vect[3])) {
        std::cerr << "[WARNING] CEDate::JD2GregorianVect() :: Bad date (" << jd << ")!" << std::endl ;
        return std::vector<double>(4,0.0) ;
    } else {
        // Fill the double vector from the integer values
        full_gregorian_vect[0] = 1.0*gregorian_date[0] ;
        full_gregorian_vect[1] = 1.0*gregorian_date[1] ;
        full_gregorian_vect[2] = 1.0*gregorian_date[2] ;
    }
    
    return full_gregorian_vect ;
}